

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeVariability
          (AsciiParser *this,Variability *variability,bool *varying_authored)

{
  bool bVar1;
  uint64_t pos;
  uint64_t loc;
  string tok;
  bool *varying_authored_local;
  Variability *variability_local;
  AsciiParser *this_local;
  
  tok.field_2._8_8_ = varying_authored;
  bVar1 = SkipWhitespace(this);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&loc);
    pos = CurrLoc(this);
    bVar1 = ReadIdentifier(this,(string *)&loc);
    if (bVar1) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&loc,"uniform");
      if (bVar1) {
        *variability = Uniform;
        *(undefined1 *)tok.field_2._8_8_ = 0;
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&loc,"varying");
        if (bVar1) {
          *variability = Varying;
          *(undefined1 *)tok.field_2._8_8_ = 1;
        }
        else {
          *(undefined1 *)tok.field_2._8_8_ = 0;
          SeekTo(this,pos);
        }
      }
      bVar1 = SkipWhitespace(this);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      SeekTo(this,pos);
      this_local._7_1_ = false;
    }
    ::std::__cxx11::string::~string((string *)&loc);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::MaybeVariability(tinyusdz::Variability *variability,
                                   bool *varying_authored) {
  if (!SkipWhitespace()) {
    return false;
  }

  std::string tok;

  auto loc = CurrLoc();
  if (!ReadIdentifier(&tok)) {
    SeekTo(loc);
    return false;
  }

  if (tok == "uniform") {
    (*variability) = tinyusdz::Variability::Uniform;
    (*varying_authored) = false;
  } else if (tok == "varying") {
    (*variability) = tinyusdz::Variability::Varying;
    (*varying_authored) = true;
  } else {
    (*varying_authored) = false;
    // rewind
    SeekTo(loc);
  }

  if (!SkipWhitespace()) {
    return false;
  }

  return true;
}